

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O2

int ilog(uint v)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = v - 1;
  iVar1 = 0;
  if (v == 0) {
    uVar2 = 0;
    iVar1 = 0;
  }
  for (; uVar2 != 0; uVar2 = uVar2 >> 1) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

static int ilog(unsigned int v){
  int ret=0;
  if(v)--v;
  while(v){
    ret++;
    v>>=1;
  }
  return(ret);
}